

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O1

bool __thiscall QRestReply::hasError(QRestReply *this)

{
  Data *pDVar1;
  int iVar2;
  NetworkError NVar3;
  bool bVar4;
  
  pDVar1 = (this->wrapped).wp.d;
  if (pDVar1 != (Data *)0x0) {
    bVar4 = false;
    if (((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0) &&
       (bVar4 = false, (this->wrapped).wp.value != (QObject *)0x0)) {
      iVar2 = httpStatus(this);
      NVar3 = QNetworkReply::error((QNetworkReply *)(this->wrapped).wp.value);
      if (iVar2 < 1) {
        bVar4 = NVar3 != NoError;
      }
      else {
        bVar4 = NVar3 == RemoteHostClosedError;
      }
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool isNull() const noexcept { return d == nullptr || d->strongref.loadRelaxed() == 0 || value == nullptr; }